

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfDeque.c
# Opt level: O2

void sbfDeque_pushFront(sbfDeque dq,void *vp)

{
  sbfDequeItemImpl *psVar1;
  sbfDequeItemImpl *psVar2;
  
  psVar1 = (sbfDequeItemImpl *)sbfPool_get(dq->mPool);
  psVar1->mPointer = vp;
  psVar2 = (dq->mList).tqh_first;
  (psVar1->mListEntry).tqe_next = psVar2;
  if (psVar2 == (sbfDequeItemImpl *)0x0) {
    psVar2 = (sbfDequeItemImpl *)dq;
  }
  (psVar2->mListEntry).tqe_prev = &(psVar1->mListEntry).tqe_next;
  (dq->mList).tqh_first = psVar1;
  (psVar1->mListEntry).tqe_prev = &(dq->mList).tqh_first;
  return;
}

Assistant:

void
sbfDeque_pushFront (sbfDeque dq, void* vp)
{
    sbfDequeItem dqe;

    dqe = sbfPool_get (dq->mPool);
    dqe->mPointer = vp;
    TAILQ_INSERT_HEAD (&dq->mList, dqe, mListEntry);
}